

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

QPDFFileSpecObjectHelper * __thiscall
QPDFFileSpecObjectHelper::setDescription(QPDFFileSpecObjectHelper *this,string *desc)

{
  QPDFObjectHandle local_70 [2];
  allocator<char> local_49;
  string local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  string *desc_local;
  QPDFFileSpecObjectHelper *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)desc;
  desc_local = (string *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Desc",&local_49);
  QPDFObjectHandle::newUnicodeString(local_70,(string *)local_18._M_pi);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&stack0xffffffffffffffd8,&local_48,local_70);
  QPDFObjectHandle::~QPDFObjectHandle(local_70);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return this;
}

Assistant:

QPDFFileSpecObjectHelper&
QPDFFileSpecObjectHelper::setDescription(std::string const& desc)
{
    oh().replaceKey("/Desc", QPDFObjectHandle::newUnicodeString(desc));
    return *this;
}